

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::optional<pbrt::SampledGrid<pbrt::RGB>_>::optional
          (optional<pbrt::SampledGrid<pbrt::RGB>_> *this,optional<pbrt::SampledGrid<pbrt::RGB>_> *v)

{
  bool bVar1;
  SampledGrid<pbrt::RGB> *pSVar2;
  
  bVar1 = v->set;
  this->set = bVar1;
  if (bVar1 == true) {
    pSVar2 = value(v);
    pbrt::SampledGrid<pbrt::RGB>::SampledGrid((SampledGrid<pbrt::RGB> *)this,pSVar2);
    reset(v);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    bool has_value() const { return set; }